

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeImageType
          (Builder *this,Id sampledType,Dim dim,bool depth,bool arrayed,bool ms,uint sampled,
          ImageFormat format)

{
  pointer ppIVar1;
  Id *pIVar2;
  Capability CVar3;
  Builder *this_00;
  Id IVar4;
  Instruction *this_01;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Instruction *local_58;
  uint local_4c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  Vector<Instruction_*> *local_40;
  Builder *local_38;
  
  if (1 < sampled - 1) {
    __assert_fail("sampled == 1 || sampled == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x1de,
                  "Id spv::Builder::makeImageType(Id, Dim, bool, bool, bool, unsigned int, ImageFormat)"
                 );
  }
  local_40 = this->groupedTypes + 0x19;
  ppIVar1 = this->groupedTypes[0x19].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)this->groupedTypes[0x19].
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3;
  uVar5 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    local_58 = ppIVar1[uVar5];
    pIVar2 = (local_58->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((((*pIVar2 == sampledType) && (pIVar2[1] == dim)) && (pIVar2[2] == (uint)depth)) &&
       (((pIVar2[3] == (uint)arrayed && (pIVar2[4] == (uint)ms)) &&
        ((pIVar2[5] == sampled && (pIVar2[6] == format)))))) goto LAB_00197386;
  }
  local_38 = this;
  this_01 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
  this_00 = local_38;
  IVar4 = local_38->uniqueId + 1;
  local_38->uniqueId = IVar4;
  this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  this_01->resultId = IVar4;
  this_01->typeId = 0;
  this_01->opCode = OpTypeImage;
  (this_01->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01->block = (Block *)0x0;
  local_58 = this_01;
  local_4c = (uint)ms;
  Instruction::addIdOperand(this_01,sampledType);
  Instruction::addImmediateOperand(this_01,dim);
  Instruction::addImmediateOperand(this_01,(uint)depth);
  Instruction::addImmediateOperand(this_01,(uint)arrayed);
  Instruction::addImmediateOperand(this_01,local_4c);
  Instruction::addImmediateOperand(this_01,sampled);
  Instruction::addImmediateOperand(this_01,format);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (local_40,&local_58);
  local_48._M_head_impl = local_58;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this_00->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this_00->module,local_58);
  switch(dim) {
  case Dim1D:
    if (sampled != 1) {
      CVar3 = CapabilityImage1D;
LAB_00197348:
      addCapability(this_00,CVar3);
      goto switchD_001972e8_caseD_1;
    }
    CVar3 = CapabilitySampled1D;
    break;
  default:
switchD_001972e8_caseD_1:
    if (!ms || sampled != 2) goto LAB_00197386;
    if (dim != DimSubpassData) {
      addCapability(this_00,CapabilityStorageImageMultisample);
    }
    if (!arrayed) goto LAB_00197386;
    goto LAB_00197376;
  case DimCube:
    if (!arrayed) goto switchD_001972e8_caseD_1;
    if (sampled != 1) {
      CVar3 = CapabilityImageCubeArray;
      goto LAB_00197348;
    }
    CVar3 = CapabilitySampledCubeArray;
    break;
  case DimRect:
    if (sampled != 1) {
      CVar3 = CapabilityImageRect;
      goto LAB_00197348;
    }
    CVar3 = CapabilitySampledRect;
    break;
  case DimBuffer:
    if (sampled != 1) {
      CVar3 = CapabilityImageBuffer;
      goto LAB_00197348;
    }
    CVar3 = CapabilitySampledBuffer;
    break;
  case DimSubpassData:
    addCapability(this_00,CapabilityInputAttachment);
    if (!arrayed || (sampled != 2 || !ms)) goto LAB_00197386;
LAB_00197376:
    CVar3 = CapabilityImageMSArray;
  }
  addCapability(this_00,CVar3);
LAB_00197386:
  return local_58->resultId;
}

Assistant:

Id Builder::makeImageType(Id sampledType, Dim dim, bool depth, bool arrayed, bool ms, unsigned sampled, ImageFormat format)
{
    assert(sampled == 1 || sampled == 2);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeImage].size(); ++t) {
        type = groupedTypes[OpTypeImage][t];
        if (type->getIdOperand(0) == sampledType &&
            type->getImmediateOperand(1) == (unsigned int)dim &&
            type->getImmediateOperand(2) == (  depth ? 1u : 0u) &&
            type->getImmediateOperand(3) == (arrayed ? 1u : 0u) &&
            type->getImmediateOperand(4) == (     ms ? 1u : 0u) &&
            type->getImmediateOperand(5) == sampled &&
            type->getImmediateOperand(6) == (unsigned int)format)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeImage);
    type->addIdOperand(sampledType);
    type->addImmediateOperand(   dim);
    type->addImmediateOperand(  depth ? 1 : 0);
    type->addImmediateOperand(arrayed ? 1 : 0);
    type->addImmediateOperand(     ms ? 1 : 0);
    type->addImmediateOperand(sampled);
    type->addImmediateOperand((unsigned int)format);

    groupedTypes[OpTypeImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // deal with capabilities
    switch (dim) {
    case DimBuffer:
        if (sampled == 1)
            addCapability(CapabilitySampledBuffer);
        else
            addCapability(CapabilityImageBuffer);
        break;
    case Dim1D:
        if (sampled == 1)
            addCapability(CapabilitySampled1D);
        else
            addCapability(CapabilityImage1D);
        break;
    case DimCube:
        if (arrayed) {
            if (sampled == 1)
                addCapability(CapabilitySampledCubeArray);
            else
                addCapability(CapabilityImageCubeArray);
        }
        break;
    case DimRect:
        if (sampled == 1)
            addCapability(CapabilitySampledRect);
        else
            addCapability(CapabilityImageRect);
        break;
    case DimSubpassData:
        addCapability(CapabilityInputAttachment);
        break;
    default:
        break;
    }

    if (ms) {
        if (sampled == 2) {
            // Images used with subpass data are not storage
            // images, so don't require the capability for them.
            if (dim != Dim::DimSubpassData)
                addCapability(CapabilityStorageImageMultisample);
            if (arrayed)
                addCapability(CapabilityImageMSArray);
        }
    }

    return type->getResultId();
}